

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O0

void __thiscall QFileSystemModel::fetchMore(QFileSystemModel *this,QModelIndex *parent)

{
  long lVar1;
  QFileSystemModelPrivate *this_00;
  QFileSystemNode *directoryPath;
  QFileSystemModelPrivate *in_RDI;
  long in_FS_OFFSET;
  QFileSystemNode *indexNode;
  QFileSystemModelPrivate *d;
  QModelIndex *in_stack_ffffffffffffffb0;
  QModelIndex *in_stack_ffffffffffffffe0;
  QFileSystemModel *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QFileSystemModel *)0xaa4e3f);
  if (((this_00->setRootPath & 1U) != 0) &&
     (directoryPath = QFileSystemModelPrivate::node(in_RDI,in_stack_ffffffffffffffb0),
     (directoryPath->populatedChildren & 1U) == 0)) {
    directoryPath->populatedChildren = true;
    std::unique_ptr<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_>::operator->
              ((unique_ptr<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_> *)0xaa4e8f);
    filePath(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    QFileInfoGatherer::list((QFileInfoGatherer *)this_00,&directoryPath->fileName);
    QString::~QString((QString *)0xaa4ec1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFileSystemModel::fetchMore(const QModelIndex &parent)
{
    Q_D(QFileSystemModel);
    if (!d->setRootPath)
        return;
    QFileSystemModelPrivate::QFileSystemNode *indexNode = d->node(parent);
    if (indexNode->populatedChildren)
        return;
    indexNode->populatedChildren = true;
#if QT_CONFIG(filesystemwatcher)
    d->fileInfoGatherer->list(filePath(parent));
#endif
}